

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

int setupClient(Address *address)

{
  ushort uVar1;
  int __fd;
  int iVar2;
  sockaddr local_28;
  
  __fd = socket(2,1,0);
  if (__fd == -1) {
    perror_die("socket()");
  }
  printf("\x1b[32m[+] Socket successfully created.\n\x1b[0m");
  local_28.sa_data[6] = '\0';
  local_28.sa_data[7] = '\0';
  local_28.sa_data[8] = '\0';
  local_28.sa_data[9] = '\0';
  local_28.sa_data[10] = '\0';
  local_28.sa_data[0xb] = '\0';
  local_28.sa_data[0xc] = '\0';
  local_28.sa_data[0xd] = '\0';
  local_28.sa_family = 2;
  local_28.sa_data._2_4_ = inet_addr(address->ip);
  uVar1 = (ushort)address->port;
  local_28.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
  iVar2 = connect(__fd,&local_28,0x10);
  if (iVar2 == 0) {
    printf("\x1b[32m[+] Connected to the server.\n\x1b[0m");
    return __fd;
  }
  perror_die("connect()");
}

Assistant:

int 
setupClient(Address* address)
{
    /* 
     * socket() -> connect()
     */

    int sockfd;          // socket file descriptor
    int ret;

    // int addressfd;
    struct sockaddr_in server_addr;
    // struct sockaddr_in cli;

    // socket create and varification
    sockfd = socket(AF_INET, SOCK_STREAM, 0);
    if (sockfd == -1) {
        perror_die("socket()");
        exit(0);
    }
    #if DEBUG
        else
            printf(ANSI_COLOR_GREEN "[+] Socket successfully created.\n" ANSI_COLOR_RESET);
    #endif

    // clean memory space of server_addr
    #if 0
        bzero(&server_addr, sizeof(server_addr));       // bzero is deprecated. works but memset is better
                                                        // https://www.quora.com/In-C-what-is-the-difference-between-bzero-and-memset
    #else
        memset(&server_addr, '\0', sizeof(server_addr));
    #endif

    // assign IP, PORT
    server_addr.sin_family = AF_INET;
    server_addr.sin_addr.s_addr = inet_addr(address->ip);
    server_addr.sin_port = htons(address->port);

    // addressect the client socket to server socket
    ret = connect(sockfd, (struct sockaddr*) &server_addr, sizeof(server_addr));
    if (ret != 0) {
        perror_die("connect()");
    }
    #if DEBUG
        else
            printf(ANSI_COLOR_GREEN "[+] Connected to the server.\n" ANSI_COLOR_RESET);
    #endif


    return sockfd;
}